

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadhb.c
# Opt level: O1

void zreadhb(FILE *fp,int *nrow,int *ncol,int_t *nonz,doublecomplex **nzval,int_t **rowind,
            int_t **colptr)

{
  int_t *piVar1;
  void *pvVar2;
  long lVar3;
  int *piVar4;
  int_t *piVar5;
  doublecomplex *pdVar6;
  int *piVar7;
  long lVar8;
  doublecomplex *pdVar9;
  int iVar10;
  int *piVar11;
  int_t *addr;
  int iVar12;
  int_t *addr_00;
  int iVar13;
  int iVar14;
  double *pdVar15;
  int_t *addr_01;
  uint uVar16;
  double dVar17;
  int tmp;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf [100];
  char msg [256];
  int local_244;
  doublecomplex **local_240;
  int_t **local_238;
  void *local_230;
  int_t *local_228;
  int_t *local_220;
  int *local_218;
  doublecomplex *local_210;
  int_t *local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  undefined1 local_1e4;
  byte local_1e3;
  undefined1 local_1e1;
  int_t *local_1e0;
  int_t *local_1d8;
  doublecomplex *local_1d0;
  long local_1c8;
  int_t *local_1c0;
  FILE *local_1b8;
  int_t *local_1b0;
  char local_1a8 [14];
  undefined1 local_19a;
  char local_138 [264];
  
  local_240 = nzval;
  local_238 = rowind;
  local_218 = nrow;
  local_1e0 = nonz;
  fgets(local_1a8,100,(FILE *)fp);
  fputs(local_1a8,_stdout);
  iVar12 = 5;
  iVar13 = 0;
  iVar10 = 0;
  do {
    __isoc99_fscanf(fp,"%14c",local_1a8);
    local_19a = 0;
    __isoc99_sscanf(local_1a8,"%d",&local_244);
    if (iVar12 == 2) {
      iVar10 = local_244;
    }
    iVar14 = local_244;
    if (local_244 == 0) {
      iVar14 = iVar13;
    }
    if (iVar12 != 1) {
      iVar14 = iVar13;
    }
    iVar13 = iVar14;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  __isoc99_fscanf(fp,"%3c",&local_1e4);
  __isoc99_fscanf(fp,"%11c",local_1a8);
  local_1e1 = 0;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  *local_218 = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  *ncol = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  piVar5 = local_1e0;
  *local_1e0 = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  local_244 = atoi(local_1a8);
  if (local_244 != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*local_218 != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  zallocateA(*ncol,*piVar5,local_240,local_238,colptr);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  zParseIntFormat(local_1a8,&local_1e8,&local_1ec);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  zParseIntFormat(local_1a8,&local_1f0,&local_1f4);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  zParseFloatFormat(local_1a8,&local_1f8,&local_1fc);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  if (iVar13 != 0) {
    do {
      iVar12 = fgetc((FILE *)fp);
    } while (iVar12 != 10);
  }
  ReadVector(fp,*ncol + 1,*colptr,local_1e8,local_1ec);
  ReadVector(fp,*piVar5,*local_238,local_1f0,local_1f4);
  if (iVar10 != 0) {
    zReadValues(fp,*piVar5,*local_240,local_1f8,local_1fc);
  }
  if ((local_1e3 & 0xdf) != 0x53) goto LAB_001097ed;
  uVar16 = *ncol;
  piVar7 = (int *)(ulong)uVar16;
  addr_01 = *local_238;
  addr_00 = *colptr;
  local_210 = *local_240;
  iVar10 = uVar16 + 1;
  piVar1 = intMalloc(iVar10);
  if (piVar1 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xd5,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
    superlu_abort_and_exit(local_138);
  }
  local_220 = intMalloc(iVar10);
  if (local_220 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xd7,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
    superlu_abort_and_exit(local_138);
  }
  local_228 = intMalloc(*piVar5);
  if (local_228 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xd9,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
    superlu_abort_and_exit(local_138);
  }
  pvVar2 = superlu_malloc((long)*piVar5 << 4);
  local_230 = pvVar2;
  if (pvVar2 == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xdb,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
    pvVar2 = local_230;
    superlu_abort_and_exit(local_138);
  }
  if ((int)uVar16 < 1) {
    *local_220 = 0;
LAB_00109491:
    if (0 < (int)uVar16) {
      piVar4 = (int *)0x0;
      do {
        lVar3 = (long)addr_00[(long)piVar4];
        piVar11 = (int *)((long)piVar4 + 1);
        if (addr_00[(long)piVar4] < addr_00[(long)piVar4 + 1]) {
          pdVar6 = local_210 + lVar3;
          do {
            iVar12 = addr_01[lVar3];
            local_228[piVar1[iVar12]] = (int_t)piVar4;
            dVar17 = pdVar6->i;
            pdVar15 = (double *)((long)pvVar2 + (long)piVar1[iVar12] * 0x10);
            *pdVar15 = pdVar6->r;
            pdVar15[1] = dVar17;
            piVar1[iVar12] = piVar1[iVar12] + 1;
            lVar3 = lVar3 + 1;
            pdVar6 = pdVar6 + 1;
          } while (lVar3 < addr_00[(long)piVar11]);
        }
        piVar4 = piVar11;
      } while (piVar11 != piVar7);
    }
  }
  else {
    memset(piVar1,0,(long)piVar7 * 4);
    piVar4 = (int *)0x0;
    do {
      lVar3 = (long)addr_00[(long)piVar4];
      piVar11 = (int *)((long)piVar4 + 1);
      if (addr_00[(long)piVar4] < addr_00[(long)piVar4 + 1]) {
        do {
          piVar1[addr_01[lVar3]] = piVar1[addr_01[lVar3]] + 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 < addr_00[(long)piVar11]);
      }
      piVar4 = piVar11;
    } while (piVar11 != piVar7);
    *local_220 = 0;
    if (0 < (int)uVar16) {
      piVar4 = (int *)0x0;
      do {
        local_220[(long)piVar4 + 1] = piVar1[(long)piVar4] + local_220[(long)piVar4];
        piVar1[(long)piVar4] = local_220[(long)piVar4];
        piVar4 = (int *)((long)piVar4 + 1);
        pvVar2 = local_230;
      } while (piVar7 != piVar4);
      goto LAB_00109491;
    }
  }
  lVar3 = (long)*piVar5 * 2 - (long)(int)uVar16;
  local_208 = intMalloc(iVar10);
  if (local_208 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xf4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
    superlu_abort_and_exit(local_138);
  }
  local_1c0 = piVar1;
  local_1b8 = (FILE *)fp;
  piVar5 = intMalloc((int_t)lVar3);
  local_1d8 = addr_01;
  if (piVar5 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xf6,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
    addr_01 = local_1d8;
    superlu_abort_and_exit(local_138);
  }
  local_1c8 = lVar3;
  pdVar6 = (doublecomplex *)superlu_malloc(lVar3 * 0x10);
  if (pdVar6 == (doublecomplex *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xf8,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
    superlu_abort_and_exit(local_138);
  }
  *local_208 = 0;
  piVar1 = local_220;
  addr = local_228;
  if (0 < (int)uVar16) {
    uVar16 = 0;
    piVar4 = (int *)0x0;
    local_1b0 = addr_00;
    do {
      lVar3 = (long)piVar1[(long)piVar4];
      piVar11 = (int *)((long)piVar4 + 1);
      if (piVar1[(long)piVar4] < piVar1[(long)piVar4 + 1]) {
        pdVar15 = (double *)(lVar3 * 0x10 + (long)local_230);
        local_218 = piVar4;
        do {
          if (piVar4 != (int *)(ulong)(uint)addr[lVar3]) {
            piVar5[(int)uVar16] = addr[lVar3];
            pdVar9 = pdVar6 + (int)uVar16;
            dVar17 = pdVar15[1];
            pdVar6[(int)uVar16].r = *pdVar15;
            pdVar6[(int)uVar16].i = dVar17;
            dVar17 = z_abs1(pdVar9);
            if (dVar17 < 4.047e-300) {
              printf("%5d: %e\t%e\n",pdVar9->r,pdVar9->i,(ulong)uVar16);
            }
            uVar16 = uVar16 + 1;
            piVar4 = local_218;
            piVar1 = local_220;
            addr = local_228;
          }
          lVar3 = lVar3 + 1;
          pdVar15 = pdVar15 + 2;
        } while (lVar3 < piVar1[(long)piVar11]);
      }
      lVar3 = (long)local_1b0[(long)piVar4];
      if (local_1b0[(long)piVar4] < local_1b0[(long)piVar11]) {
        lVar8 = (long)(int)uVar16 << 2;
        pdVar9 = local_210 + lVar3;
        do {
          *(int_t *)((long)piVar5 + lVar8) = local_1d8[lVar3];
          dVar17 = pdVar9->i;
          pdVar15 = (double *)((long)&pdVar6->r + lVar8 * 4);
          *pdVar15 = pdVar9->r;
          pdVar15[1] = dVar17;
          lVar3 = lVar3 + 1;
          uVar16 = uVar16 + 1;
          lVar8 = lVar8 + 4;
          pdVar9 = pdVar9 + 1;
        } while (lVar3 < local_1b0[(long)piVar11]);
      }
      local_208[(long)piVar11] = uVar16;
      piVar4 = piVar11;
      addr_00 = local_1b0;
      addr_01 = local_1d8;
    } while (piVar11 != piVar7);
  }
  lVar3 = local_1c8;
  local_1d0 = pdVar6;
  printf("FormFullA: new_nnz = %lld\n",local_1c8);
  superlu_free(local_210);
  superlu_free(addr_01);
  superlu_free(addr_00);
  superlu_free(local_1c0);
  superlu_free(local_230);
  superlu_free(addr);
  superlu_free(piVar1);
  *local_240 = local_1d0;
  *local_238 = piVar5;
  *colptr = local_208;
  *local_1e0 = (int_t)lVar3;
  fp = (FILE *)local_1b8;
LAB_001097ed:
  fclose((FILE *)fp);
  return;
}

Assistant:

void
zreadhb(FILE *fp, int *nrow, int *ncol, int_t *nonz,
	doublecomplex **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0, rhscrd = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<5; i++) {
	fscanf(fp, "%14c", buf); buf[14] = 0;
	sscanf(buf, "%d", &tmp);
	if (i == 3) numer_lines = tmp;
	if (i == 4 && tmp) rhscrd = tmp;
    }
    zDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#if ( DEBUGlevel>=1 )
    printf("Matrix type %s\n", type);
#endif
    
    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);
    
    if (tmp != 0)
	  printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
	printf("Matrix is not square.\n");
    zDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    zallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    zParseFloatFormat(buf, &valnum, &valsize);
    fscanf(fp, "%20c", buf);
    zDumpLine(fp);

    /* Line 5: right-hand side */    
    if ( rhscrd ) zDumpLine(fp); /* skip RHSFMT */
    
#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif
    
    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        zReadValues(fp, *nonz, *nzval, valnum, valsize);
    }
    
    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}